

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aligned_containers.h
# Opt level: O0

ThreadEntry * __thiscall
density_tests::
aligned_allocator<density_tests::HeterLoadUnloadTest<density::lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<256UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>::ThreadEntry>
::allocate(aligned_allocator<density_tests::HeterLoadUnloadTest<density::lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<256UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>::ThreadEntry>
           *this,size_t i_count)

{
  ThreadEntry *pTVar1;
  size_t i_count_local;
  aligned_allocator<density_tests::HeterLoadUnloadTest<density::lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<256UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>::ThreadEntry>
  *this_local;
  
  pTVar1 = (ThreadEntry *)density::aligned_allocate(i_count << 6,0x40,0);
  return pTVar1;
}

Assistant:

TYPE * allocate(std::size_t i_count)
        {
            return static_cast<TYPE *>(
              density::aligned_allocate(i_count * sizeof(TYPE), alignof(TYPE)));
        }